

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse_fasta_digest.cpp
# Opt level: O2

void __thiscall argparse::args_t::args_t(args_t *this,int argc,char **argv)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  int local_3c;
  char **local_38;
  
  this->input = _stdin;
  this->output = _stdout;
  local_38 = &this->motif_list;
  this->motif_list = (char *)0x0;
  this->rc = complement;
  this->match = exact;
  local_3c = 1;
  do {
    if (argc <= local_3c) {
      if (*local_38 == (char *)0x0) {
        ERROR("Required argument MOTIF_LIST was not provided");
        return;
      }
      return;
    }
    pcVar3 = argv[local_3c];
    if (*pcVar3 == '-') {
      cVar1 = pcVar3[1];
      if (cVar1 == 'r') {
        pcVar3 = next_arg(&local_3c,argc,argv);
        parse_rc_option(this,pcVar3);
      }
      else if (cVar1 == 'e') {
        pcVar3 = next_arg(&local_3c,argc,argv);
        parse_motif(this,pcVar3);
      }
      else if (cVar1 == 'h') {
        if (pcVar3[2] == '\0') {
LAB_00105da1:
          help();
        }
        else {
LAB_00105d15:
          ERROR("unknown argument: %s",pcVar3);
        }
      }
      else if (cVar1 == 'm') {
        pcVar3 = next_arg(&local_3c,argc,argv);
        parse_match_mode(this,pcVar3);
      }
      else {
        if (cVar1 != 'o') {
          if ((cVar1 == '-') && (iVar2 = strcmp(pcVar3 + 2,"help"), iVar2 == 0)) goto LAB_00105da1;
          goto LAB_00105d15;
        }
        pcVar3 = next_arg(&local_3c,argc,argv);
        parse_output(this,pcVar3);
      }
    }
    else {
      if (local_3c != argc + -1) goto LAB_00105d15;
      parse_input(this,pcVar3);
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

args_t::args_t( int argc, const char * argv[] ) :
    input( stdin ),
    output( stdout ),
    rc ( DEFAULT_RC ),
    match (DEFAULT_MATCH),
    motif_list (NULL)
    {
        // skip arg[0], it's just the program name
        for (int i = 1; i < argc; ++i ) {
            const char * arg = argv[i];
            
            if ( arg[0] == '-' && arg[1] == '-' ) {
                if ( !strcmp( &arg[2], "help" ) ) help();
                else
                    ERROR( "unknown argument: %s", arg );
            }
            else if ( arg[0] == '-' ) {
                if ( !strcmp( &arg[1], "h" ) ) help();
                else if (  arg[1] == 'o' ) parse_output( next_arg (i, argc, argv) );
                else if (  arg[1] == 'r')  parse_rc_option ( next_arg (i, argc, argv) );
                else if (  arg[1] == 'm')  parse_match_mode( next_arg (i, argc, argv) );
                else if (  arg[1] == 'e')  parse_motif( next_arg (i, argc, argv) );
                else
                    ERROR( "unknown argument: %s", arg );
            }
            else
                if (i == argc-1) {
                    parse_input (arg);
                } else {
                    ERROR( "unknown argument: %s", arg );
                }
        }
                
        if (motif_list == NULL) {
            ERROR ("Required argument MOTIF_LIST was not provided");
        }
    }